

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

KOption getoption(Header *h,char **fmt,size_t *size)

{
  char *pcVar1;
  uint uVar2;
  size_t sVar3;
  size_t maxalign;
  int opt;
  size_t *size_local;
  char **fmt_local;
  Header *h_local;
  
  pcVar1 = *fmt;
  *fmt = pcVar1 + 1;
  uVar2 = (uint)*pcVar1;
  *size = 0;
  switch(uVar2) {
  case 0x20:
    goto LAB_00128a2d;
  case 0x21:
    uVar2 = getnumlimit(h,fmt,8);
    h->maxalign = uVar2;
    goto LAB_00128a2d;
  default:
    luaL_error(h->L,"invalid format option \'%c\'",(ulong)uVar2);
    goto LAB_00128a2d;
  case 0x3c:
    h->islittle = 1;
    goto LAB_00128a2d;
  case 0x3d:
    h->islittle = 1;
    goto LAB_00128a2d;
  case 0x3e:
    h->islittle = 0;
LAB_00128a2d:
    h_local._4_4_ = Knop;
    break;
  case 0x42:
    *size = 1;
    h_local._4_4_ = Kuint;
    break;
  case 0x48:
    *size = 2;
    h_local._4_4_ = Kuint;
    break;
  case 0x49:
    uVar2 = getnumlimit(h,fmt,4);
    *size = (ulong)uVar2;
    h_local._4_4_ = Kuint;
    break;
  case 0x4a:
    *size = 8;
    h_local._4_4_ = Kuint;
    break;
  case 0x4c:
    *size = 8;
    h_local._4_4_ = Kuint;
    break;
  case 0x54:
    *size = 8;
    h_local._4_4_ = Kuint;
    break;
  case 0x58:
    h_local._4_4_ = Kpaddalign;
    break;
  case 0x62:
    *size = 1;
    h_local._4_4_ = Kint;
    break;
  case 99:
    sVar3 = getnum(fmt,0xffffffffffffffff);
    *size = sVar3;
    if (*size == 0xffffffffffffffff) {
      luaL_error(h->L,"missing size for format option \'c\'");
    }
    h_local._4_4_ = Kchar;
    break;
  case 100:
    *size = 8;
    h_local._4_4_ = Kdouble;
    break;
  case 0x66:
    *size = 4;
    h_local._4_4_ = Kfloat;
    break;
  case 0x68:
    *size = 2;
    h_local._4_4_ = Kint;
    break;
  case 0x69:
    uVar2 = getnumlimit(h,fmt,4);
    *size = (ulong)uVar2;
    h_local._4_4_ = Kint;
    break;
  case 0x6a:
    *size = 8;
    h_local._4_4_ = Kint;
    break;
  case 0x6c:
    *size = 8;
    h_local._4_4_ = Kint;
    break;
  case 0x6e:
    *size = 8;
    h_local._4_4_ = Knumber;
    break;
  case 0x73:
    uVar2 = getnumlimit(h,fmt,8);
    *size = (ulong)uVar2;
    h_local._4_4_ = Kstring;
    break;
  case 0x78:
    *size = 1;
    h_local._4_4_ = Kpadding;
    break;
  case 0x7a:
    h_local._4_4_ = Kzstr;
  }
  return h_local._4_4_;
}

Assistant:

static KOption getoption (Header *h, const char **fmt, size_t *size) {
  /* dummy structure to get native alignment requirements */
  struct cD { char c; union { LUAI_MAXALIGN; } u; };
  int opt = *((*fmt)++);
  *size = 0;  /* default */
  switch (opt) {
    case 'b': *size = sizeof(char); return Kint;
    case 'B': *size = sizeof(char); return Kuint;
    case 'h': *size = sizeof(short); return Kint;
    case 'H': *size = sizeof(short); return Kuint;
    case 'l': *size = sizeof(long); return Kint;
    case 'L': *size = sizeof(long); return Kuint;
    case 'j': *size = sizeof(lua_Integer); return Kint;
    case 'J': *size = sizeof(lua_Integer); return Kuint;
    case 'T': *size = sizeof(size_t); return Kuint;
    case 'f': *size = sizeof(float); return Kfloat;
    case 'n': *size = sizeof(lua_Number); return Knumber;
    case 'd': *size = sizeof(double); return Kdouble;
    case 'i': *size = getnumlimit(h, fmt, sizeof(int)); return Kint;
    case 'I': *size = getnumlimit(h, fmt, sizeof(int)); return Kuint;
    case 's': *size = getnumlimit(h, fmt, sizeof(size_t)); return Kstring;
    case 'c':
      *size = getnum(fmt, cast_sizet(-1));
      if (l_unlikely(*size == cast_sizet(-1)))
        luaL_error(h->L, "missing size for format option 'c'");
      return Kchar;
    case 'z': return Kzstr;
    case 'x': *size = 1; return Kpadding;
    case 'X': return Kpaddalign;
    case ' ': break;
    case '<': h->islittle = 1; break;
    case '>': h->islittle = 0; break;
    case '=': h->islittle = nativeendian.little; break;
    case '!': {
      const size_t maxalign = offsetof(struct cD, u);
      h->maxalign = getnumlimit(h, fmt, maxalign);
      break;
    }
    default: luaL_error(h->L, "invalid format option '%c'", opt);
  }
  return Knop;
}